

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O1

void __thiscall glslang::TIntermAggregate::TIntermAggregate(TIntermAggregate *this)

{
  TPoolAllocator *pTVar1;
  
  TIntermTyped::TIntermTyped((TIntermTyped *)this,EbtFloat);
  (this->super_TIntermOperator).op = EOpNull;
  (this->super_TIntermOperator).operationPrecision = EpqNone;
  (this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00b10030;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Tp_alloc_type.allocator = pTVar1;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar1;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qualifier).
  super_vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>.
  super__Vector_base<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = GetThreadPoolAllocator();
  (this->name)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->userDefined = false;
  this->pragmaTable = (TPragmaTable *)0x0;
  TSpirvInstruction::TSpirvInstruction(&this->spirvInst);
  this->linkType = ELinkNone;
  (this->endLoc).name = (TString *)0x0;
  (this->endLoc).string = 0;
  (this->endLoc).line = 0;
  (this->endLoc).column = 0;
  return;
}

Assistant:

TIntermAggregate() : TIntermOperator(EOpNull), userDefined(false), pragmaTable(nullptr) { 
        endLoc.init();
    }